

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Iprobe(int source,int tag,MPIABI_Comm comm,int *flag,MPIABI_Status *status)

{
  MPIABI_Status *pMVar1;
  int iVar2;
  ompi_communicator_t *poVar3;
  MPI_Status *pMVar4;
  WPI_StatusPtr local_38;
  WPI_Handle local_30 [8];
  MPIABI_Status *local_28;
  MPIABI_Status *status_local;
  int *flag_local;
  MPIABI_Comm comm_local;
  int tag_local;
  int source_local;
  
  local_28 = status;
  status_local = (MPIABI_Status *)flag;
  flag_local = (int *)comm;
  comm_local._0_4_ = tag;
  comm_local._4_4_ = source;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_30,comm);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_30);
  pMVar1 = status_local;
  WPI_StatusPtr::WPI_StatusPtr(&local_38,local_28);
  pMVar4 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_38);
  iVar2 = MPI_Iprobe(source,tag,poVar3,pMVar1,pMVar4);
  WPI_StatusPtr::~WPI_StatusPtr(&local_38);
  return iVar2;
}

Assistant:

int MPIABI_Iprobe(
  int source,
  int tag,
  MPIABI_Comm comm,
  int * flag,
  MPIABI_Status * status
) {
  return MPI_Iprobe(
    source,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    flag,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}